

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O2

void __thiscall absl::debugging_internal::ElfMemImage::Init(ElfMemImage *this,void *base)

{
  Elf64_Sym *pEVar1;
  Elf64_Addr EVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  Elf64_Ehdr *pEVar6;
  Elf64_Phdr *pEVar7;
  long *plVar8;
  Elf64_Phdr *pEVar9;
  Elf64_Phdr *pEVar10;
  int i;
  uint index;
  undefined1 auVar11 [16];
  
  this->strsize_ = 0;
  this->verdefnum_ = 0;
  this->hash_ = (Elf64_Word *)0x0;
  this->dynstr_ = (char *)0x0;
  this->versym_ = (Elf64_Versym *)0x0;
  this->verdef_ = (Elf64_Verdef *)0x0;
  this->ehdr_ = (Elf64_Ehdr *)0x0;
  this->dynsym_ = (Elf64_Sym *)0x0;
  this->link_base_ = 0xffffffffffffffff;
  if (base != (void *)0x0) {
    if ((((*base != '\x7f') || (*(char *)((long)base + 1) != 'E')) ||
        (*(char *)((long)base + 2) != 'L')) || (*(char *)((long)base + 3) != 'F')) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/debugging/internal/elf_mem_image.cc"
                    ,0xa9,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    if (*(char *)((long)base + 4) != '\x02') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/debugging/internal/elf_mem_image.cc"
                    ,0xae,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    if (*(char *)((long)base + 5) != '\x01') {
      if (*(char *)((long)base + 5) != '\x02') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/debugging/internal/elf_mem_image.cc"
                      ,0xc1,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
      }
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/debugging/internal/elf_mem_image.cc"
                    ,0xbb,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    this->ehdr_ = (Elf64_Ehdr *)base;
    pEVar6 = (Elf64_Ehdr *)base;
    pEVar9 = (Elf64_Phdr *)0x0;
    for (index = 0; index < pEVar6->e_phnum; index = index + 1) {
      pEVar7 = GetPhdr(this,index);
      pEVar10 = pEVar7;
      if (((pEVar7->p_type != 2) && (pEVar10 = pEVar9, pEVar7->p_type == 1)) &&
         (this->link_base_ == 0xffffffffffffffff)) {
        this->link_base_ = pEVar7->p_vaddr;
      }
      pEVar6 = this->ehdr_;
      pEVar9 = pEVar10;
    }
    EVar2 = this->link_base_;
    if ((EVar2 == 0xffffffffffffffff) || (pEVar9 == (Elf64_Phdr *)0x0)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/debugging/internal/elf_mem_image.cc"
                    ,0xd6,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    for (plVar8 = (long *)((long)base + (pEVar9->p_vaddr - EVar2)); lVar3 = *plVar8, lVar3 != 0;
        plVar8 = plVar8 + 2) {
      sVar4 = plVar8[1];
      pEVar1 = (Elf64_Sym *)((long)base + (sVar4 - EVar2));
      switch(lVar3) {
      case 4:
        this->hash_ = (Elf64_Word *)pEVar1;
        break;
      case 5:
        this->dynstr_ = (char *)pEVar1;
        break;
      case 6:
        this->dynsym_ = pEVar1;
        break;
      case 7:
      case 8:
      case 9:
        break;
      case 10:
        this->strsize_ = sVar4;
        break;
      default:
        if (lVar3 == 0x6ffffff0) {
          this->versym_ = (Elf64_Versym *)pEVar1;
        }
        else if (lVar3 == 0x6ffffffc) {
          this->verdef_ = (Elf64_Verdef *)pEVar1;
        }
        else if (lVar3 == 0x6ffffffd) {
          this->verdefnum_ = sVar4;
        }
      }
    }
    auVar11._0_4_ = -(uint)((int)((ulong)this->hash_ >> 0x20) == 0 && (int)this->hash_ == 0);
    auVar11._4_4_ = -(uint)((int)this->dynsym_ == 0 && (int)((ulong)this->dynsym_ >> 0x20) == 0);
    auVar11._8_4_ = -(uint)((int)((ulong)this->dynstr_ >> 0x20) == 0 && (int)this->dynstr_ == 0);
    auVar11._12_4_ = -(uint)((int)this->versym_ == 0 && (int)((ulong)this->versym_ >> 0x20) == 0);
    iVar5 = movmskps((int)plVar8,auVar11);
    if ((((iVar5 != 0) || (this->verdef_ == (Elf64_Verdef *)0x0)) || (this->verdefnum_ == 0)) ||
       (this->strsize_ == 0)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/debugging/internal/elf_mem_image.cc"
                    ,0xff,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
  }
  return;
}

Assistant:

void ElfMemImage::Init(const void *base) {
  ehdr_      = nullptr;
  dynsym_    = nullptr;
  dynstr_    = nullptr;
  versym_    = nullptr;
  verdef_    = nullptr;
  hash_      = nullptr;
  strsize_   = 0;
  verdefnum_ = 0;
  link_base_ = ~0L;  // Sentinel: PT_LOAD .p_vaddr can't possibly be this.
  if (!base) {
    return;
  }
  const char *const base_as_char = reinterpret_cast<const char *>(base);
  if (base_as_char[EI_MAG0] != ELFMAG0 || base_as_char[EI_MAG1] != ELFMAG1 ||
      base_as_char[EI_MAG2] != ELFMAG2 || base_as_char[EI_MAG3] != ELFMAG3) {
    assert(false);
    return;
  }
  int elf_class = base_as_char[EI_CLASS];
  if (elf_class != kElfClass) {
    assert(false);
    return;
  }
  switch (base_as_char[EI_DATA]) {
    case ELFDATA2LSB: {
#ifndef ABSL_IS_LITTLE_ENDIAN
      assert(false);
      return;
#endif
      break;
    }
    case ELFDATA2MSB: {
#ifndef ABSL_IS_BIG_ENDIAN
      assert(false);
      return;
#endif
      break;
    }
    default: {
      assert(false);
      return;
    }
  }

  ehdr_ = reinterpret_cast<const ElfW(Ehdr) *>(base);
  const ElfW(Phdr) *dynamic_program_header = nullptr;
  for (int i = 0; i < ehdr_->e_phnum; ++i) {
    const ElfW(Phdr) *const program_header = GetPhdr(i);
    switch (program_header->p_type) {
      case PT_LOAD:
        if (!~link_base_) {
          link_base_ = program_header->p_vaddr;
        }
        break;
      case PT_DYNAMIC:
        dynamic_program_header = program_header;
        break;
    }
  }
  if (!~link_base_ || !dynamic_program_header) {
    assert(false);
    // Mark this image as not present. Can not recur infinitely.
    Init(nullptr);
    return;
  }
  ptrdiff_t relocation =
      base_as_char - reinterpret_cast<const char *>(link_base_);
  ElfW(Dyn) *dynamic_entry =
      reinterpret_cast<ElfW(Dyn) *>(dynamic_program_header->p_vaddr +
                                    relocation);
  for (; dynamic_entry->d_tag != DT_NULL; ++dynamic_entry) {
    const auto value = dynamic_entry->d_un.d_val + relocation;
    switch (dynamic_entry->d_tag) {
      case DT_HASH:
        hash_ = reinterpret_cast<ElfW(Word) *>(value);
        break;
      case DT_SYMTAB:
        dynsym_ = reinterpret_cast<ElfW(Sym) *>(value);
        break;
      case DT_STRTAB:
        dynstr_ = reinterpret_cast<const char *>(value);
        break;
      case DT_VERSYM:
        versym_ = reinterpret_cast<ElfW(Versym) *>(value);
        break;
      case DT_VERDEF:
        verdef_ = reinterpret_cast<ElfW(Verdef) *>(value);
        break;
      case DT_VERDEFNUM:
        verdefnum_ = dynamic_entry->d_un.d_val;
        break;
      case DT_STRSZ:
        strsize_ = dynamic_entry->d_un.d_val;
        break;
      default:
        // Unrecognized entries explicitly ignored.
        break;
    }
  }
  if (!hash_ || !dynsym_ || !dynstr_ || !versym_ ||
      !verdef_ || !verdefnum_ || !strsize_) {
    assert(false);  // invalid VDSO
    // Mark this image as not present. Can not recur infinitely.
    Init(nullptr);
    return;
  }
}